

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

Expression * wasm::I64Utilities::recreateI64(Builder *builder,Expression *low,Expression *high)

{
  Unary *left;
  Unary *left_00;
  Const *right;
  Binary *pBVar1;
  
  left = Builder::makeUnary(builder,ExtendUInt32,low);
  left_00 = Builder::makeUnary(builder,ExtendUInt32,high);
  right = Builder::makeConst<long>(builder,0x20);
  pBVar1 = Builder::makeBinary(builder,ShlInt64,(Expression *)left_00,(Expression *)right);
  pBVar1 = Builder::makeBinary(builder,OrInt64,(Expression *)left,(Expression *)pBVar1);
  return (Expression *)pBVar1;
}

Assistant:

static Expression*
  recreateI64(Builder& builder, Expression* low, Expression* high) {
    return builder.makeBinary(
      OrInt64,
      builder.makeUnary(ExtendUInt32, low),
      builder.makeBinary(ShlInt64,
                         builder.makeUnary(ExtendUInt32, high),
                         builder.makeConst(int64_t(32))));
  }